

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::check_spot_timeseries_args_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  char *option;
  bool bVar1;
  Options *opts_00;
  long lVar2;
  ConfigManager tmpmgr;
  ConfigManager CStack_58;
  string local_48;
  
  bVar1 = cali::ConfigManager::Options::is_enabled((Options *)this,"timeseries");
  if (bVar1) {
    cali::ConfigManager::ConfigManager(&CStack_58);
    cali::ConfigManager::add_config_spec(&CStack_58,(ConfigInfo *)spot_timeseries_info);
    get_timeseries_config_string_abi_cxx11_(&local_48,this,opts_00);
    cali::ConfigManager::check_abi_cxx11_
              (__return_storage_ptr__,&CStack_58,local_48._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_48);
    cali::ConfigManager::~ConfigManager(&CStack_58);
  }
  else {
    lVar2 = 0;
    do {
      if (lVar2 == 0x28) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_48);
        return __return_storage_ptr__;
      }
      option = *(char **)((long)&PTR_anon_var_dwarf_4972d7_00291370 + lVar2);
      bVar1 = cali::ConfigManager::Options::is_set((Options *)this,option);
      lVar2 = lVar2 + 8;
    } while (!bVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,option,(allocator<char> *)&CStack_58);
    std::operator+(__return_storage_ptr__,&local_48,
                   " is set but the timeseries option is not enabled");
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string check_spot_timeseries_args(const cali::ConfigManager::Options& opts)
{
    if (opts.is_enabled("timeseries")) {
        // Check if the timeseries options are valid

        cali::ConfigManager tmpmgr;

        tmpmgr.add_config_spec(spot_timeseries_info);
        return tmpmgr.check(get_timeseries_config_string(opts).c_str());
    } else {
        // Warn when a timeseries option is set but timeseries is disabled

        const char* tsopts[] = { "timeseries.maxrows",
                                 "timeseries.iteration_interval",
                                 "timeseries.time_interval",
                                 "timeseries.target_loops",
                                 "timeseries.metrics" };

        for (const char* opt : tsopts)
            if (opts.is_set(opt))
                return std::string(opt) + " is set but the timeseries option is not enabled";
    }

    return "";
}